

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O3

Lit __thiscall Minisat::Solver::pickBranchLit(Solver *this)

{
  int i;
  double *pdVar1;
  uint uVar2;
  int iVar3;
  uint *puVar4;
  Heap<Minisat::Solver::VarOrderLt> *this_00;
  double dVar5;
  
  iVar3 = -1;
  while (((iVar3 == -1 || (((this->assigns).data[iVar3].value & 2) == 0)) ||
         ((this->decision).data[iVar3] == '\0'))) {
    this_00 = this->order_heap;
    if ((this_00->heap).sz == 0) {
      return (Lit)-2;
    }
    if (this->current_heuristic == CHB) {
      iVar3 = *(this_00->heap).data;
      uVar2 = (uint)this->conflicts;
      puVar4 = (this->canceled).data;
      while (uVar2 - puVar4[iVar3] != 0) {
        dVar5 = pow(0.95,(double)(uVar2 - puVar4[iVar3]));
        pdVar1 = (this->activity_CHB).data;
        pdVar1[iVar3] = dVar5 * pdVar1[iVar3];
        this_00 = this->order_heap;
        if ((iVar3 < (this_00->indices).sz) && (i = (this_00->indices).data[iVar3], -1 < i)) {
          Heap<Minisat::Solver::VarOrderLt>::percolateDown(this_00,i);
          this_00 = this->order_heap;
        }
        uVar2 = (uint)this->conflicts;
        puVar4 = (this->canceled).data;
        puVar4[iVar3] = uVar2;
        iVar3 = *(this_00->heap).data;
      }
    }
    iVar3 = Heap<Minisat::Solver::VarOrderLt>::removeMin(this_00);
  }
  if ((this->posMissingInSome != 0) && (this->negMissingInSome != 0)) {
    return (Lit)((uint)((this->polarity).data[iVar3] != '\0') + iVar3 * 2);
  }
  return (Lit)((uint)(this->posMissingInSome != 0) + iVar3 * 2);
}

Assistant:

Lit Solver::pickBranchLit()
{
    Var next = var_Undef;

    // Random decision:
    /*if (drand(random_seed) < random_var_freq && !order_heap.empty()){
        next = order_heap[irand(random_seed,order_heap.size())];
        if (value(next) == l_Undef && decision[next])
            rnd_decisions++; }*/

    // Activity based decision:
    while (next == var_Undef || value(next) != l_Undef || !decision[next])
        if (order_heap->empty())
            return lit_Undef;
        else {
#ifdef ANTI_EXPLORATION
            if (usesCHB()) {
                Var v = (*order_heap)[0];
                uint32_t age = conflicts - canceled[v];
                while (age > 0) {
                    double decay = pow(0.95, age);
                    activity_CHB[v] *= decay;
                    if (order_heap->inHeap(v)) order_heap->increase(v);
                    canceled[v] = conflicts;
                    v = (*order_heap)[0];
                    age = conflicts - canceled[v];
                }
            }
#endif
            next = order_heap->removeMin();
        }

    // in case we found (almost) pure literals, disable phase-saving
    if (posMissingInSome == 0 || negMissingInSome == 0)
        return posMissingInSome == 0 ? mkLit(next, false) : mkLit(next, true);

    return mkLit(next, polarity[next]);
}